

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtiming.cpp
# Opt level: O0

void print_elapsed_time_proc(Am_Object *interp)

{
  int iVar1;
  Am_Value *pAVar2;
  long lVar3;
  ostream *poVar4;
  void *pvVar5;
  Am_Time local_60 [8];
  long local_58;
  long ms;
  Am_Time stop;
  int n;
  Am_Object local_28;
  Am_Object_Method local_20;
  Am_Object *local_10;
  Am_Object *interp_local;
  
  local_10 = interp;
  Am_Object::Get_Prototype();
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_28,0xca);
  Am_Object_Method::Am_Object_Method(&local_20,pAVar2);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffc0,(Am_Object *)interp);
  (*local_20.Call)((Am_Object_Data *)&stack0xffffffffffffffc0);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffc0);
  Am_Object::~Am_Object(&local_28);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)interp,0x169);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  Am_Time::Now();
  Am_Time::operator-(local_60,(Am_Time *)&ms);
  lVar3 = Am_Time::Milliseconds();
  Am_Time::~Am_Time(local_60);
  local_58 = lVar3;
  poVar4 = std::operator<<((ostream *)&std::cout,"Animation constraint executed ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4," steps in ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,local_58);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"for average cost of ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(double)local_58 / (double)iVar1);
  poVar4 = std::operator<<(poVar4," ms per iteration.");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
  Am_Exit_Main_Event_Loop();
  Am_Time::~Am_Time((Am_Time *)&ms);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, print_elapsed_time, (Am_Object interp))
{
  Am_Object_Method(interp.Get_Prototype().Get(Am_DO_METHOD)).Call(interp);

  int n = interp.Get(Am_VALUE);
  Am_Time stop = Am_Time::Now();

  long ms = (stop - start).Milliseconds();

  std::cout << "Animation constraint executed " << n << " steps in " << ms
            << std::endl
            << "for average cost of " << double(ms) / n << " ms per iteration."
            << std::endl
            << std::flush;

  Am_Exit_Main_Event_Loop();
}